

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O2

int decode_nal_units(HEVCContext *h,uint8_t *bs,uint64_t bs_len)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  void *pvVar5;
  uint8_t *puVar6;
  uint8_t uVar7;
  ulong uVar8;
  uint uVar9;
  uint8_t *__dest;
  int iVar10;
  bool bVar11;
  
  uVar2 = 0;
  do {
    lVar3 = (long)(int)uVar2;
    while( true ) {
      if (bs_len <= lVar3 + 3U) {
        return 0;
      }
      if (((bs[lVar3] == '\0') && (bs[lVar3 + 1] == '\0')) && (bs[lVar3 + 2] == '\x01')) break;
      lVar3 = lVar3 + 1;
    }
    h->nal_unit_type = bs[lVar3 + 3] >> 1 & (NAL_VPS|NAL_BLA_W_LP|NAL_RASL_N|NAL_RADL_R);
    uVar9 = (int)lVar3 + 5;
    h->temporal_id = (bs[(long)(int)lVar3 + 4] & 7) - 1;
    uVar4 = (ulong)uVar9;
    do {
      while( true ) {
        uVar1 = (uint)uVar4;
        uVar2 = uVar1;
        if (bs_len <= (ulong)(long)(int)(uVar1 + 3)) goto LAB_00104dc1;
        if (bs[(int)uVar1] == '\0') break;
        uVar4 = (ulong)(uVar1 + 2);
      }
      uVar2 = uVar9;
      if (uVar9 != uVar1) {
        uVar2 = uVar1 - (bs[(long)(int)uVar1 + -1] == '\0');
      }
      uVar4 = (long)(int)uVar2 + 2;
    } while (((bs_len <= uVar4) || (bs[(long)(int)uVar2 + 1] != '\0')) || (3 < bs[uVar4]));
    if (bs[uVar4] == 3) {
LAB_00104dc1:
      puVar6 = bs + (int)uVar9;
LAB_00104dcb:
      lVar3 = bs_len - (long)(int)uVar9;
      uVar4 = lVar3 + 0x10;
      __dest = h->rbsp_buffer;
      if (h->rbsp_buffer_size < uVar4) {
        if (__dest != (uint8_t *)0x0) {
          free(__dest + -(long)(char)__dest[-1]);
        }
        if (lVar3 - 0x7fffffd0U < 0xffffffff80000021) {
          __dest = (uint8_t *)0x0;
        }
        else {
          pvVar5 = malloc(lVar3 + 0x30);
          if (pvVar5 == (void *)0x0) {
            __dest = (uint8_t *)0x0;
          }
          else {
            __dest = (uint8_t *)((long)pvVar5 + 0x20U & 0xffffffffffffffe0);
            __dest[-1] = ((byte)((long)pvVar5 + 0x20U) & 0xe0) - (char)pvVar5;
          }
        }
        h->rbsp_buffer = __dest;
        if (__dest == (uint8_t *)0x0) {
          uVar4 = 0;
        }
        h->rbsp_buffer_size = uVar4;
      }
      if (__dest == (uint8_t *)0x0) {
        fwrite("Error Alloc memory for RBSP\n",0x1c,1,_stderr);
        return -1;
      }
      iVar10 = uVar2 - uVar9;
      memcpy(__dest,puVar6,(long)iVar10);
      while( true ) {
        uVar8 = (ulong)(int)uVar2;
        uVar4 = uVar8 + 2;
        if (bs_len <= uVar4) break;
        uVar7 = bs[(int)uVar2];
        if (bs[uVar4] < 4) {
          if (uVar7 != '\0') goto LAB_00104edf;
          if (bs[(long)(int)uVar2 + 1] != '\0') {
            uVar7 = '\0';
            goto LAB_00104edf;
          }
          if (bs[uVar4] != 3) goto LAB_00104f2a;
          (__dest + iVar10)[0] = '\0';
          (__dest + iVar10)[1] = '\0';
          iVar10 = iVar10 + 2;
          uVar2 = uVar2 + 3;
        }
        else {
          __dest[iVar10] = uVar7;
          __dest[(long)iVar10 + 1] = bs[(long)(int)uVar2 + 1];
          uVar7 = bs[uVar4];
          uVar2 = (uint)uVar4;
          iVar10 = iVar10 + 2;
LAB_00104edf:
          uVar2 = uVar2 + 1;
          lVar3 = (long)iVar10;
          iVar10 = iVar10 + 1;
          __dest[lVar3] = uVar7;
        }
      }
      puVar6 = __dest + iVar10;
      for (; uVar8 < bs_len; uVar8 = uVar8 + 1) {
        *puVar6 = bs[uVar8];
        iVar10 = iVar10 + 1;
        puVar6 = puVar6 + 1;
      }
      uVar2 = (uint)uVar8;
    }
    else {
      iVar10 = uVar2 - uVar9;
      puVar6 = bs + (int)uVar9;
      __dest = puVar6;
      if (iVar10 == -1) goto LAB_00104dcb;
    }
LAB_00104f2a:
    uVar9 = iVar10 * 8 + 8;
    uVar4 = (long)iVar10 + 1;
    do {
      if (uVar4 == 1) {
        uVar9 = 0;
        goto LAB_00104f61;
      }
      uVar8 = uVar4 - 1;
      uVar9 = uVar9 - 8;
      lVar3 = uVar4 - 2;
      uVar4 = uVar8;
    } while (__dest[lVar3] == '\0');
    if (0xfffffff < uVar8) {
      uVar9 = 0xfffffff8;
    }
LAB_00104f61:
    bVar11 = 0x7ffffff7 < uVar9;
    if (bVar11) {
      uVar9 = 0;
    }
    puVar6 = (uint8_t *)0x0;
    if (!bVar11) {
      puVar6 = __dest;
    }
    if (__dest == (uint8_t *)0x0) {
      uVar9 = 0;
    }
    (h->gb).buffer = puVar6;
    (h->gb).size_in_bits = uVar9;
    (h->gb).size_in_bits_plus8 = uVar9 + 8;
    (h->gb).buffer_end = puVar6 + ((int)uVar9 >> 3);
    (h->gb).index = 0;
    decode_nal_unit(h);
  } while( true );
}

Assistant:

int decode_nal_units(HEVCContext *h, const uint8_t *bs, uint64_t bs_len)
{
    //decode all NAL units in an Access Unit
    int ptr_bs = 0;
    while(1)
    {
        //1. parse NAL start code
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs] == 0 && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] == 1)
                break;
            ptr_bs++;
        }
        if(ptr_bs + 3 >= bs_len)
            break;
        ptr_bs += 3;

        //2. NAL Unit header
        h->nal_unit_type = (enum NALUnitType)((bs[ptr_bs++] & 0x7F) >> 1);
        h->temporal_id = (bs[ptr_bs++] & 0x7) - 1;

        //3. Extract emulated code
        int ptr_bs_back = ptr_bs;
        int nalu_length = -1;
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs])
            {
                ptr_bs += 2;
                continue;
            }
            if(ptr_bs != ptr_bs_back && !bs[ptr_bs - 1])
                ptr_bs--;
            if(ptr_bs + 2 < bs_len && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] <= 3)
            {
                if(bs[ptr_bs + 2] != 3)
                    nalu_length = ptr_bs - ptr_bs_back;
                break;
            }
            ptr_bs += 2;
        }
        uint8_t *rbsp = (uint8_t *)(bs + ptr_bs_back);
        int rbsp_len = nalu_length;

        //4. Has 0x000003, very rare
        if(nalu_length == -1)
        {
            fd_fast_realloc((void **)&h->rbsp_buffer, &h->rbsp_buffer_size, bs_len - ptr_bs_back + 16);
            if(!h->rbsp_buffer)
            {
                fprintf(stderr, "Error Alloc memory for RBSP\n");
                return -1;
            }
            rbsp = h->rbsp_buffer;
            memcpy(rbsp, bs + ptr_bs_back, ptr_bs - ptr_bs_back);
            int si = ptr_bs;
            int di = ptr_bs - ptr_bs_back;
            while(si + 2 < bs_len)
            {
                if(bs[si + 2] > 3)
                {
                    rbsp[di++] = bs[si++];
                    rbsp[di++] = bs[si++];
                }
                else if(bs[si] == 0 && bs[si + 1] == 0)
                {
                    if(bs[si + 2] == 3)
                    {
                        rbsp[di++] = 0;
                        rbsp[di++] = 0;
                        si += 3;
                        continue;
                    }
                    goto nsc;
                }
                rbsp[di++] = bs[si++];
            }
            while(si < bs_len)
                rbsp[di++] = bs[si++];
nsc:
            rbsp_len = di;
            ptr_bs = si;
        }
//        for(int i = 0; i < rbsp_len; i++)
//            printf("%02x\n", rbsp[i]);

        while(rbsp_len && rbsp[rbsp_len - 1] == 0)
            rbsp_len--;
        //5. Initial get bits context
        init_get_bits8(&h->gb, rbsp, rbsp_len);

        //6. Decode this NAL Unit with this RBSP.
        decode_nal_unit(h);
    }
    return 0;
}